

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionGraph.cpp
# Opt level: O0

bool ContainsData(ScopeData *scope,bool checkImported)

{
  TypeBase *node;
  bool bVar1;
  uint uVar2;
  TypeBase **ppTVar3;
  TypeClass *pTVar4;
  FunctionData **ppFVar5;
  VariableData **ppVVar6;
  AliasData **ppAVar7;
  ScopeData **ppSVar8;
  bool local_55;
  bool local_4d;
  uint local_48;
  uint i_4;
  bool imported_3;
  uint i_3;
  bool imported_2;
  uint i_2;
  bool ownerFunctionImported;
  bool imported_1;
  uint i_1;
  bool imported;
  TypeBase *data;
  uint i;
  bool checkImported_local;
  ScopeData *scope_local;
  
  data._0_4_ = 0;
  while( true ) {
    uVar2 = SmallArray<TypeBase_*,_2U>::size(&scope->types);
    if (uVar2 <= (uint)data) {
      for (i_2 = 0; uVar2 = SmallArray<FunctionData_*,_2U>::size(&scope->functions), i_2 < uVar2;
          i_2 = i_2 + 1) {
        ppFVar5 = SmallArray<FunctionData_*,_2U>::operator[](&scope->functions,i_2);
        if (checkImported == ((*ppFVar5)->importModule != (ModuleData *)0x0)) {
          return true;
        }
      }
      local_55 = false;
      if (scope->ownerFunction != (FunctionData *)0x0) {
        local_55 = scope->ownerFunction->importModule != (ModuleData *)0x0;
      }
      if ((scope->ownerFunction == (FunctionData *)0x0) || (checkImported == local_55)) {
        for (i_3 = 0; uVar2 = SmallArray<VariableData_*,_4U>::size(&scope->variables), i_3 < uVar2;
            i_3 = i_3 + 1) {
          ppVVar6 = SmallArray<VariableData_*,_4U>::operator[](&scope->variables,i_3);
          if (checkImported == ((*ppVVar6)->importModule != (ModuleData *)0x0)) {
            return true;
          }
        }
      }
      for (i_4 = 0; uVar2 = SmallArray<AliasData_*,_2U>::size(&scope->aliases), i_4 < uVar2;
          i_4 = i_4 + 1) {
        ppAVar7 = SmallArray<AliasData_*,_2U>::operator[](&scope->aliases,i_4);
        if (checkImported == ((*ppAVar7)->importModule != (ModuleData *)0x0)) {
          return true;
        }
      }
      local_48 = 0;
      while( true ) {
        uVar2 = SmallArray<ScopeData_*,_2U>::size(&scope->scopes);
        if (uVar2 <= local_48) {
          return false;
        }
        ppSVar8 = SmallArray<ScopeData_*,_2U>::operator[](&scope->scopes,local_48);
        bVar1 = ContainsData(*ppSVar8,checkImported);
        if (bVar1) break;
        local_48 = local_48 + 1;
      }
      return true;
    }
    ppTVar3 = SmallArray<TypeBase_*,_2U>::operator[](&scope->types,(uint)data);
    node = *ppTVar3;
    pTVar4 = getType<TypeClass>(node);
    local_4d = false;
    if (pTVar4 != (TypeClass *)0x0) {
      pTVar4 = getType<TypeClass>(node);
      local_4d = (pTVar4->super_TypeStruct).super_TypeBase.importModule != (ModuleData *)0x0;
    }
    if (checkImported == local_4d) break;
    data._0_4_ = (uint)data + 1;
  }
  return true;
}

Assistant:

bool ContainsData(ScopeData *scope, bool checkImported)
{
	for(unsigned i = 0; i < scope->types.size(); i++)
	{
		TypeBase *data = scope->types[i];

		bool imported = getType<TypeClass>(data) && getType<TypeClass>(data)->importModule != NULL;

		if(checkImported == imported)
			return true;
	}

	for(unsigned i = 0; i < scope->functions.size(); i++)
	{
		bool imported = scope->functions[i]->importModule != NULL;

		if(checkImported == imported)
			return true;
	}

	bool ownerFunctionImported = scope->ownerFunction && scope->ownerFunction->importModule != NULL;

	if(!scope->ownerFunction || checkImported == ownerFunctionImported)
	{
		for(unsigned i = 0; i < scope->variables.size(); i++)
		{
			bool imported = scope->variables[i]->importModule != NULL;

			if(checkImported == imported)
				return true;
		}
	}

	for(unsigned i = 0; i < scope->aliases.size(); i++)
	{
		bool imported = scope->aliases[i]->importModule != NULL;

		if(checkImported == imported)
			return true;
	}

	for(unsigned i = 0; i < scope->scopes.size(); i++)
	{
		if(ContainsData(scope->scopes[i], checkImported))
			return true;
	}

	return false;
}